

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penguinv.cpp
# Opt level: O0

void penguinV::Fill(Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,uint8_t value)

{
  bool bVar1;
  FunctionTableHolder *pFVar2;
  reference puVar3;
  uint32_t in_ECX;
  uint32_t in_EDX;
  uint32_t in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  uint32_t in_R8D;
  uint8_t in_R9B;
  ImageManager manager;
  FillForm2 funcTemp;
  const_iterator type;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *types;
  uint8_t imageType;
  FillForm2 func;
  ImageTypeManager *registrator;
  ImageTypeManager *in_stack_fffffffffffffef8;
  uint8_t requiredType;
  FunctionTableHolder *in_stack_ffffffffffffff00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff10;
  ImageManager *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  uint8_t in_stack_ffffffffffffff3f;
  ImageTypeManager *in_stack_ffffffffffffff40;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_60;
  undefined1 local_58 [24];
  undefined1 *local_40;
  uint8_t local_31;
  FillForm2 local_30;
  ImageTypeManager *local_28;
  uint8_t local_19;
  
  local_19 = in_R9B;
  local_28 = ImageTypeManager::instance();
  PenguinV_Image::ImageTemplate<unsigned_char>::type(in_RDI);
  pFVar2 = ImageTypeManager::functionTable(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3f);
  local_30 = pFVar2->Fill;
  local_31 = PenguinV_Image::ImageTemplate<unsigned_char>::type(in_RDI);
  if ((local_30 == (FillForm2)0x0) &&
     (bVar1 = ImageTypeManager::isIntertypeConversionEnabled(local_28), bVar1)) {
    ImageTypeManager::imageTypes
              ((ImageTypeManager *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    local_40 = local_58;
    local_60._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             in_stack_fffffffffffffef8);
    while( true ) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffef8)
      ;
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)in_stack_ffffffffffffff00,
                         (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)in_stack_fffffffffffffef8);
      if (!bVar1) break;
      in_stack_fffffffffffffef8 = local_28;
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator*(&local_60);
      in_stack_ffffffffffffff00 =
           ImageTypeManager::functionTable(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3f);
      if (in_stack_ffffffffffffff00->Fill != (FillForm2)0x0) {
        local_30 = in_stack_ffffffffffffff00->Fill;
        puVar3 = __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator*(&local_60);
        local_31 = *puVar3;
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator++(&local_60);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_ffffffffffffff10);
  }
  requiredType = (uint8_t)((ulong)in_stack_fffffffffffffef8 >> 0x38);
  (anonymous_namespace)::
  verifyFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int,unsigned_char)>
            ((_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint_uchar *)
             CONCAT44(in_ESI,in_EDX),(char *)CONCAT44(in_ECX,in_R8D));
  anon_unknown.dwarf_353bb::ImageManager::ImageManager
            ((ImageManager *)in_stack_ffffffffffffff00,requiredType);
  (*local_30)(in_RDI,in_ESI,in_EDX,in_ECX,in_R8D,local_19);
  anon_unknown.dwarf_353bb::ImageManager::~ImageManager(in_stack_ffffffffffffff30);
  return;
}

Assistant:

void Fill( Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height, uint8_t value )
    {
        initialize( image, Fill )
        func( image, x, y, width, height, value );
    }